

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int parse_source_token(Context *ctx,SourceArgInfo *info)

{
  uint32 uVar1;
  uint uVar2;
  SourceMod SVar3;
  int iVar4;
  uint *puVar5;
  MOJOSHADER_swizzle *pMVar6;
  VariableList *pVVar7;
  RegisterList *pRVar8;
  uint uVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  RegisterType RVar13;
  long lVar14;
  RegisterList *item;
  uint uVar15;
  
  uVar1 = ctx->tokencount;
  if (uVar1 == 0) {
    failf(ctx,"%s","Out of tokens in source parameter");
    return 0;
  }
  puVar5 = ctx->tokens;
  uVar2 = *puVar5;
  info->token = puVar5;
  uVar12 = uVar2 & 0x7ff;
  info->regnum = uVar12;
  info->relative = uVar2 >> 0xd & 1;
  uVar9 = uVar2 >> 0x10 & 0xff;
  info->src_mod = uVar2 >> 0x18 & (SRCMOD_TOTAL|SRCMOD_NEGATE);
  RVar13 = uVar2 >> 8 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT) | uVar2 >> 0x1c & REG_TYPE_CONSTINT
  ;
  info->regtype = RVar13;
  if (RVar13 < REG_TYPE_CONST3) {
    if (RVar13 == REG_TYPE_INPUT) {
      if (((ulong)ctx->swizzles_count != 0) &&
         (pRVar8 = (ctx->attributes).next, pRVar8 != (RegisterList *)0x0)) {
        do {
          uVar15 = pRVar8->regtype << 0x10 | pRVar8->regnum;
          if ((uVar12 | 0x10000) == uVar15) {
            pMVar6 = ctx->swizzles;
            lVar14 = 0;
            goto LAB_0011ae47;
          }
        } while ((uVar15 <= (uVar12 | 0x10000)) &&
                (pRVar8 = pRVar8->next, pRVar8 != (RegisterList *)0x0));
      }
    }
    else if (RVar13 == REG_TYPE_CONST2) {
      info->regtype = REG_TYPE_CONST;
      uVar12 = uVar12 | 0x800;
      goto LAB_0011aa6f;
    }
  }
  else {
    if (RVar13 == REG_TYPE_CONST3) {
      info->regtype = REG_TYPE_CONST;
      uVar12 = uVar12 | 0x1000;
    }
    else {
      if (RVar13 != REG_TYPE_CONST4) goto LAB_0011aa73;
      info->regtype = REG_TYPE_CONST;
      uVar12 = uVar12 | 0x1800;
    }
LAB_0011aa6f:
    info->regnum = uVar12;
  }
  goto LAB_0011aa73;
  while (lVar14 = lVar14 + 0xc, (ulong)ctx->swizzles_count * 0xc != lVar14) {
LAB_0011ae47:
    if ((*(MOJOSHADER_usage *)(pMVar6->swizzles + lVar14 + -8) == pRVar8->usage) &&
       (*(uint *)(pMVar6->swizzles + lVar14 + -4) == pRVar8->index)) {
      uVar9 = (uint)pMVar6->swizzles[lVar14 + (ulong)(uVar2 >> 0x16 & 3)] << 6 |
              (uint)pMVar6->swizzles[lVar14 + (ulong)(uVar2 >> 0x14 & 3)] << 4 |
              (uint)pMVar6->swizzles[lVar14 + (ulong)(uVar2 >> 0x12 & 3)] << 2 |
              (uint)pMVar6->swizzles[lVar14 + (ulong)(uVar2 >> 0x10 & 3)];
      break;
    }
  }
LAB_0011aa73:
  info->swizzle = uVar9;
  info->swizzle_x = uVar9 & 3;
  info->swizzle_y = uVar9 >> 2 & 3;
  info->swizzle_z = uVar9 >> 4 & 3;
  info->swizzle_w = uVar9 >> 6 & 3;
  ctx->tokens = puVar5 + 1;
  ctx->tokencount = uVar1 - 1;
  ctx->current_position = ctx->current_position + 4;
  if ((uVar2 & 0xc000) != 0) {
    failf(ctx,"%s","Reserved bits #1 in source token must be zero");
  }
  if (-1 < (int)uVar2) {
    failf(ctx,"%s","Reserved bit #2 in source token must be one");
  }
  iVar11 = 1;
  if (info->relative != 0) {
    if (ctx->tokencount == 0) {
      failf(ctx,"%s","Out of tokens in relative source parameter");
      info->relative = 0;
    }
    else {
      if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) && (ctx->major_ver < 3)) {
        failf(ctx,"%s","Relative addressing in pixel shader version < 3.0");
      }
      if (ctx->major_ver < 2) {
        info->relative_regtype = REG_TYPE_ADDRESS;
        info->relative_regnum = 0;
        iVar11 = 1;
        uVar9 = 0;
      }
      else {
        uVar2 = *ctx->tokens;
        ctx->tokens = ctx->tokens + 1;
        ctx->tokencount = ctx->tokencount - 1;
        ctx->current_position = ctx->current_position + 4;
        info->relative_regnum = uVar2 & 0x7ff;
        info->relative_regtype =
             uVar2 >> 8 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT) |
             uVar2 >> 0x1c & REG_TYPE_CONSTINT;
        if (-1 < (int)uVar2) {
          failf(ctx,"%s","bit #31 in relative address must be set");
        }
        if ((uVar2 & 0xf00e000) != 0) {
          failf(ctx,"%s","relative address reserved bit must be zero");
        }
        if ((info->relative_regtype != REG_TYPE_ADDRESS) &&
           (info->relative_regtype != REG_TYPE_LOOP)) {
          failf(ctx,"%s","invalid register for relative address");
        }
        if (info->relative_regnum != 0) {
          failf(ctx,"%s","invalid register for relative address");
        }
        uVar9 = uVar2 >> 0x10 & 3;
        if (((uVar9 != (uVar2 >> 0x12 & 3)) || (uVar9 != (uVar2 >> 0x14 & 3))) ||
           (iVar11 = 2, uVar9 != (uVar2 >> 0x16 & 3))) {
          failf(ctx,"%s","relative address needs replicate swizzle");
          iVar11 = 2;
        }
      }
      info->relative_component = uVar9;
      if (info->regtype == REG_TYPE_CONST) {
        if (ctx->ignores_ctab == 0) {
          if ((ctx->ctab).have_ctab == 0) {
            pcVar10 = "relative addressing unsupported without a CTAB";
          }
          else {
            determine_constants_arrays(ctx);
            pVVar7 = ctx->variables;
            if (pVVar7 != (VariableList *)0x0) {
              do {
                if ((pVVar7->index <= info->regnum) &&
                   (info->regnum < pVVar7->index + pVVar7->count)) {
                  pVVar7->used = 1;
                  info->relative_array = pVVar7;
                  RVar13 = info->relative_regtype;
                  iVar4 = info->relative_regnum;
                  if (0 < iVar4 && RVar13 == REG_TYPE_COLOROUT) {
                    ctx->have_multi_color_outputs = 1;
                  }
                  reglist_insert(ctx,&ctx->used_registers,RVar13,iVar4);
                  goto LAB_0011ad44;
                }
                pVVar7 = pVVar7->next;
              } while (pVVar7 != (VariableList *)0x0);
            }
            pcVar10 = "relative addressing of indeterminate array";
          }
          goto LAB_0011ad3a;
        }
      }
      else if (info->regtype == REG_TYPE_INPUT) {
        if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) || (ctx->major_ver < 3)) {
          failf(ctx,"%s","relative addressing of input registers not supported in this shader model"
               );
        }
        ctx->have_relative_input_registers = 1;
      }
      else {
        pcVar10 = "relative addressing of invalid register";
LAB_0011ad3a:
        failf(ctx,"%s",pcVar10);
      }
    }
  }
LAB_0011ad44:
  SVar3 = info->src_mod;
  if (SVar3 < SRCMOD_TOTAL) {
    if ((0x7fcU >> (SVar3 & 0x1f) & 1) == 0) {
      if ((((0x1803U >> (SVar3 & 0x1f) & 1) != 0) || (ctx->major_ver < 2)) ||
         (info->regtype == REG_TYPE_MAX)) goto LAB_0011ad88;
      pcVar10 = "NOT only allowed on predicate register.";
    }
    else {
      if (ctx->major_ver < 2) goto LAB_0011ad88;
      pcVar10 = "illegal source mod for this Shader Model.";
    }
  }
  else {
    pcVar10 = "Unknown source modifier";
  }
  failf(ctx,"%s",pcVar10);
LAB_0011ad88:
  if (ctx->isfail == 0) {
    iVar4 = info->regnum;
    RVar13 = info->regtype;
    if (0 < iVar4 && RVar13 == REG_TYPE_COLOROUT) {
      ctx->have_multi_color_outputs = 1;
    }
    pRVar8 = reglist_insert(ctx,&ctx->used_registers,RVar13,iVar4);
    if ((pRVar8 != (RegisterList *)0x0 && info->regtype == REG_TYPE_TEMP) && (pRVar8->written == 0))
    {
      failf(ctx,"Temp register r%d used uninitialized",(ulong)(uint)info->regnum);
    }
  }
  return iVar11;
}

Assistant:

static int parse_source_token(Context *ctx, SourceArgInfo *info)
{
    int retval = 1;

    if (ctx->tokencount == 0)
    {
        fail(ctx, "Out of tokens in source parameter");
        return 0;
    } // if

    const uint32 token = SWAP32(*(ctx->tokens));
    const int reserved1 = (int) ((token >> 14) & 0x3); // bits 14 through 15
    const int reserved2 = (int) ((token >> 31) & 0x1); // bit 31

    info->token = ctx->tokens;
    info->regnum = (int) (token & 0x7ff);  // bits 0 through 10
    info->relative = (int) ((token >> 13) & 0x1); // bit 13
    const int swizzle = (int) ((token >> 16) & 0xFF); // bits 16 through 23
    info->src_mod = (SourceMod) ((token >> 24) & 0xF); // bits 24 through 27
    info->regtype = (RegisterType) (((token >> 28) & 0x7) | ((token >> 8) & 0x18));  // bits 28-30, 11-12

    // all the REG_TYPE_CONSTx types are the same register type, it's just
    //  split up so its regnum can be > 2047 in the bytecode. Clean it up.
    if (info->regtype == REG_TYPE_CONST2)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 2048;
    } // else if
    else if (info->regtype == REG_TYPE_CONST3)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 4096;
    } // else if
    else if (info->regtype == REG_TYPE_CONST4)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 6144;
    } // else if

    info->swizzle = adjust_swizzle(ctx, info->regtype, info->regnum, swizzle);
    info->swizzle_x = ((info->swizzle >> 0) & 0x3);
    info->swizzle_y = ((info->swizzle >> 2) & 0x3);
    info->swizzle_z = ((info->swizzle >> 4) & 0x3);
    info->swizzle_w = ((info->swizzle >> 6) & 0x3);

    // swallow token for now, for multiple calls in a row.
    adjust_token_position(ctx, 1);

    if (reserved1 != 0x0)
        fail(ctx, "Reserved bits #1 in source token must be zero");

    if (reserved2 != 0x1)
        fail(ctx, "Reserved bit #2 in source token must be one");

    if ((info->relative) && (ctx->tokencount == 0))
    {
        fail(ctx, "Out of tokens in relative source parameter");
        info->relative = 0;  // don't try to process it.
    } // if

    if (info->relative)
    {
        if ( (shader_is_pixel(ctx)) && (!shader_version_atleast(ctx, 3, 0)) )
            fail(ctx, "Relative addressing in pixel shader version < 3.0");

        // Shader Model 1 doesn't have an extra token to specify the
        //  relative register: it's always a0.x.
        if (!shader_version_atleast(ctx, 2, 0))
        {
            info->relative_regnum = 0;
            info->relative_regtype = REG_TYPE_ADDRESS;
            info->relative_component = 0;
        } // if

        else  // Shader Model 2 and later...
        {
            const uint32 reltoken = SWAP32(*(ctx->tokens));
            // swallow token for now, for multiple calls in a row.
            adjust_token_position(ctx, 1);

            const int relswiz = (int) ((reltoken >> 16) & 0xFF);
            info->relative_regnum = (int) (reltoken & 0x7ff);
            info->relative_regtype = (RegisterType)
                                        (((reltoken >> 28) & 0x7) |
                                        ((reltoken >> 8) & 0x18));

            if (((reltoken >> 31) & 0x1) == 0)
                fail(ctx, "bit #31 in relative address must be set");

            if ((reltoken & 0xF00E000) != 0)  // usused bits.
                fail(ctx, "relative address reserved bit must be zero");

            switch (info->relative_regtype)
            {
                case REG_TYPE_LOOP:
                case REG_TYPE_ADDRESS:
                    break;
                default:
                    fail(ctx, "invalid register for relative address");
                    break;
            } // switch

            if (info->relative_regnum != 0)  // true for now.
                fail(ctx, "invalid register for relative address");

            if (!replicate_swizzle(relswiz))
                fail(ctx, "relative address needs replicate swizzle");

            info->relative_component = (relswiz & 0x3);

            retval++;
        } // else

        if (info->regtype == REG_TYPE_INPUT)
        {
            if ( (shader_is_pixel(ctx)) || (!shader_version_atleast(ctx, 3, 0)) )
                fail(ctx, "relative addressing of input registers not supported in this shader model");
            ctx->have_relative_input_registers = 1;
        } // if
        else if (info->regtype == REG_TYPE_CONST)
        {
            // figure out what array we're in...
            if (!ctx->ignores_ctab)
            {
                if (!ctx->ctab.have_ctab)  // hard to do efficiently without!
                    fail(ctx, "relative addressing unsupported without a CTAB");
                else
                {
                    determine_constants_arrays(ctx);

                    VariableList *var;
                    const int reltarget = info->regnum;
                    for (var = ctx->variables; var != NULL; var = var->next)
                    {
                        const int lo = var->index;
                        if ( (reltarget >= lo) && (reltarget < (lo + var->count)) )
                            break;  // match!
                    } // for

                    if (var == NULL)
                        fail(ctx, "relative addressing of indeterminate array");
                    else
                    {
                        var->used = 1;
                        info->relative_array = var;
                        set_used_register(ctx, info->relative_regtype, info->relative_regnum, 0);
                    } // else
                } // else
            } // if
        } // else if
        else
        {
            fail(ctx, "relative addressing of invalid register");
        } // else
    } // if

    switch (info->src_mod)
    {
        case SRCMOD_NONE:
        case SRCMOD_ABSNEGATE:
        case SRCMOD_ABS:
        case SRCMOD_NEGATE:
            break; // okay in any shader model.

        // apparently these are only legal in Shader Model 1.x ...
        case SRCMOD_BIASNEGATE:
        case SRCMOD_BIAS:
        case SRCMOD_SIGNNEGATE:
        case SRCMOD_SIGN:
        case SRCMOD_COMPLEMENT:
        case SRCMOD_X2NEGATE:
        case SRCMOD_X2:
        case SRCMOD_DZ:
        case SRCMOD_DW:
            if (shader_version_atleast(ctx, 2, 0))
                fail(ctx, "illegal source mod for this Shader Model.");
            break;

        case SRCMOD_NOT:  // !!! FIXME: I _think_ this is right...
            if (shader_version_atleast(ctx, 2, 0))
            {
                if (info->regtype != REG_TYPE_PREDICATE)
                    fail(ctx, "NOT only allowed on predicate register.");
            } // if
            break;

        default:
            fail(ctx, "Unknown source modifier");
    } // switch

    // !!! FIXME: docs say this for sm3 ... check these!
    //  "The negate modifier cannot be used on second source register of these
    //   instructions: m3x2 - ps, m3x3 - ps, m3x4 - ps, m4x3 - ps, and
    //   m4x4 - ps."
    //  "If any version 3 shader reads from one or more constant float
    //   registers (c#), one of the following must be true.
    //    All of the constant floating-point registers must use the abs modifier.
    //    None of the constant floating-point registers can use the abs modifier.

    if (!isfail(ctx))
    {
        RegisterList *reg;
        reg = set_used_register(ctx, info->regtype, info->regnum, 0);
        // !!! FIXME: this test passes if you write to the register
        // !!! FIXME:  in this same instruction, because we parse the
        // !!! FIXME:  destination token first.
        // !!! FIXME: Microsoft's shader validation explicitly checks temp
        // !!! FIXME:  registers for this...do they check other writable ones?
        if ((info->regtype == REG_TYPE_TEMP) && (reg) && (!reg->written))
            failf(ctx, "Temp register r%d used uninitialized", info->regnum);
    } // if

    return retval;
}